

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O0

void __thiscall VarBind::VarBind(VarBind *this,shared_ptr<OIDType> *oid,SNMP_ERROR_STATUS error)

{
  NullType *this_00;
  SNMP_ERROR_STATUS error_local;
  shared_ptr<OIDType> *oid_local;
  VarBind *this_local;
  
  Catch::clara::std::shared_ptr<OIDType>::shared_ptr(&this->oid,(shared_ptr<OIDType> *)oid);
  this->type = NULLTYPE;
  this_00 = (NullType *)operator_new(0x10);
  NullType::NullType(this_00);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<NullType,void>
            ((shared_ptr<BER_CONTAINER> *)&this->value,this_00);
  this->errorStatus = error;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, SNMP_ERROR_STATUS error): oid(oid->cloneOID()), type(NULLTYPE), value(new NullType()), errorStatus(error){}